

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_arguments_and_rest.cpp
# Opt level: O1

void show_list<int,double>(int *value,double *args)

{
  ostream *poVar1;
  
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,*value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>(*args);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void show_list(const T & value, const Args & ...args) { // unpack params pack, and apply 'const &' pattern
    std::cout << value << ", ";
    //  recursive calling this function, each time to decrease one arg
    show_list(args...);
}